

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O1

qlonglong anon_unknown.dwarf_96c7d3::qMetaTypeNumberBySize(Private *d)

{
  uint *puVar1;
  uint uVar2;
  qlonglong qVar3;
  
  puVar1 = (uint *)((*(ulong *)&d->field_0x18 & 0xfffffffffffffffc) + 4);
  uVar2 = 0;
  if (*puVar1 != 0) {
    for (; (*puVar1 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
    }
  }
  qVar3 = (*(code *)(&DAT_004e60dc + *(int *)(&DAT_004e60dc + (ulong)uVar2 * 4)))();
  return qVar3;
}

Assistant:

inline const QtPrivate::QMetaTypeInterface *typeInterface() const
        {
            return reinterpret_cast<const QtPrivate::QMetaTypeInterface *>(packedType << 2);
        }